

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_pka(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  TCGContext_conflict12 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 pTVar2;
  DisasJumpType DVar3;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_i64 local_28;
  TCGTemp *local_20;
  
  if (((s->fields).presentO & 0x10000) != 0) {
    iVar1 = (s->fields).c[6];
    if (iVar1 < 0x20) {
      tcg_ctx = s->uc->tcg_ctx;
      pTVar2 = tcg_const_i32_s390x(tcg_ctx,iVar1 + 1);
      local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_30 = o->addr1 + (long)tcg_ctx;
      local_28 = o->in2 + (long)tcg_ctx;
      DVar3 = DISAS_NEXT;
      local_20 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_pka,(TCGTemp *)0x0,4,&local_38);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    else {
      gen_program_exception(s,6);
      DVar3 = DISAS_NORETURN;
    }
    return DVar3;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_pka(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int l2 = get_field(s, l2) + 1;
    TCGv_i32 l;

    /* The length must not exceed 32 bytes.  */
    if (l2 > 32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }
    l = tcg_const_i32(tcg_ctx, l2);
    gen_helper_pka(tcg_ctx, tcg_ctx->cpu_env, o->addr1, o->in2, l);
    tcg_temp_free_i32(tcg_ctx, l);
    return DISAS_NEXT;
}